

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void deqp::gls::Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
               (PixelBufferAccess *access,Vector<int,_4> *color,IVec4 *scissorArea)

{
  int y;
  int x;
  
  if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
    y = 0;
    do {
      if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
        x = 0;
        do {
          if ((((y < scissorArea->m_data[1]) ||
               (scissorArea->m_data[1] + scissorArea->m_data[3] <= y)) ||
              (x < scissorArea->m_data[0])) ||
             (scissorArea->m_data[0] + scissorArea->m_data[2] <= x)) {
            tcu::PixelBufferAccess::setPixel(access,color,x,y,0);
          }
          x = x + 1;
        } while (x < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
      }
      y = y + 1;
    } while (y < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
  }
  return;
}

Assistant:

void clearEdges (const tcu::PixelBufferAccess& access, const T& color, const IVec4& scissorArea)
{
	for (int y = 0; y < access.getHeight(); y++)
	for (int x = 0; x < access.getWidth(); x++)
	{
		if (y < scissorArea.y() ||
			y >= scissorArea.y() + scissorArea.w() ||
			x < scissorArea.x() ||
			x >= scissorArea.x()+ scissorArea.z())
			access.setPixel(color, x, y);
	}
}